

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fat.cpp
# Opt level: O1

void __thiscall fat::delete_directory(fat *this,string *dir_path)

{
  pointer pbVar1;
  ushort uVar2;
  pointer pcVar3;
  int32_t *__src;
  FILE *pFVar4;
  undefined8 uVar5;
  void *pvVar6;
  pointer pbVar7;
  pointer pdVar8;
  uint dir_cluster;
  int32_t dir_cluster_00;
  ulong uVar9;
  boot_record *pbVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  undefined1 *puVar14;
  char cVar15;
  ulong uVar16;
  short sVar17;
  short sVar18;
  uint uVar19;
  undefined1 *puStack_d0;
  undefined1 auStack_c8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  undefined1 local_90 [8];
  vector<fat::directory,_std::allocator<fat::directory>_> dir_children;
  undefined1 local_70 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  vector<fat::directory,_std::allocator<fat::directory>_> parent_children;
  
  local_90[0] = '/';
  puStack_d0 = (undefined1 *)0x106748;
  explode((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_70,(fat *)dir_path,dir_path,local_90);
  if ((undefined1  [8])
      result.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start == local_70) {
    puStack_d0 = (undefined1 *)0x106a9b;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"CANNOT DELETE ROOT",0x12);
    puStack_d0 = (undefined1 *)0x106aa7;
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  else {
    puStack_d0 = (undefined1 *)0x106765;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(auStack_c8 + 8),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_70);
    puStack_d0 = (undefined1 *)0x106774;
    dir_cluster = get_parent_cluster(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)(auStack_c8 + 8));
    puStack_d0 = (undefined1 *)0x106783;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(auStack_c8 + 8));
    puStack_d0 = (undefined1 *)0x106799;
    get_dir_children((vector<fat::directory,_std::allocator<fat::directory>_> *)local_90,this,
                     dir_cluster);
    if (dir_children.super__Vector_base<fat::directory,_std::allocator<fat::directory>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)CONCAT71(local_90._1_7_,local_90[0])) {
      if (-1 < (int)dir_cluster) {
        pbVar1 = result.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + -1;
        pcVar3 = result.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1]._M_dataplus._M_p;
        pbVar7 = result.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + -1;
        result.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = pbVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != &pbVar7->field_2) {
          puStack_d0 = (undefined1 *)0x1067d2;
          operator_delete(pcVar3);
        }
        puStack_d0 = (undefined1 *)0x1067e2;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70);
        puStack_d0 = (undefined1 *)0x1067f1;
        dir_cluster_00 = get_parent_cluster(this,&local_a8);
        puStack_d0 = (undefined1 *)0x106800;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_a8);
        puStack_d0 = (undefined1 *)0x10680f;
        get_dir_children((vector<fat::directory,_std::allocator<fat::directory>_> *)
                         &result.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,this,dir_cluster_00);
        pbVar10 = this->fs_br;
        sVar17 = 0;
        puStack_d0 = (undefined1 *)0x10684e;
        fseek((FILE *)this->fs,
              (long)dir_cluster_00 * (long)pbVar10->cluster_size +
              (long)pbVar10->usable_cluster_count * (long)pbVar10->fat_copies * 4 + 0x110,0);
        if ((pointer)parent_children.
                     super__Vector_base<fat::directory,_std::allocator<fat::directory>_>._M_impl.
                     super__Vector_impl_data._M_start !=
            result.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          lVar13 = 0;
          uVar16 = 0;
          sVar17 = 0;
          do {
            if (*(uint *)((long)&(result.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_2 +
                         lVar13 + 4) != dir_cluster) {
              puStack_d0 = (undefined1 *)0x10688b;
              fwrite((void *)((long)&((result.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + lVar13),0x18,1,(FILE *)this->fs);
              sVar17 = sVar17 + 0x18;
            }
            uVar16 = uVar16 + 1;
            uVar9 = ((long)parent_children.
                           super__Vector_base<fat::directory,_std::allocator<fat::directory>_>.
                           _M_impl.super__Vector_impl_data._M_start -
                     (long)result.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3) *
                    -0x5555555555555555;
            lVar13 = lVar13 + 0x18;
          } while (uVar16 <= uVar9 && uVar9 - uVar16 != 0);
        }
        pbVar10 = this->fs_br;
        if (sVar17 < pbVar10->cluster_size) {
          sVar18 = 1;
          do {
            puStack_d0 = (undefined1 *)0x1068d3;
            fputc(0,(FILE *)this->fs);
            iVar11 = (int)sVar18;
            pbVar10 = this->fs_br;
            sVar18 = sVar18 + 1;
          } while (iVar11 < (int)pbVar10->cluster_size - (int)sVar17);
        }
        uVar19 = pbVar10->usable_cluster_count;
        lVar13 = -((ulong)uVar19 * 4 + 0xf & 0xfffffffffffffff0);
        puVar14 = auStack_c8 + lVar13;
        lVar12 = (long)this->fs_br->usable_cluster_count;
        dir_children.super__Vector_base<fat::directory,_std::allocator<fat::directory>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)auStack_c8;
        if (0 < lVar12) {
          __src = this->fat_table;
          dir_children.super__Vector_base<fat::directory,_std::allocator<fat::directory>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)auStack_c8;
          *(undefined8 *)(auStack_c8 + lVar13 + -8) = 0x10692f;
          memcpy(puVar14,__src,lVar12 << 2);
        }
        *(int32_t *)(puVar14 + (ulong)dir_cluster * 4) = this->FAT_UNUSED;
        pFVar4 = (FILE *)this->fs;
        iVar11 = 0;
        *(undefined8 *)(auStack_c8 + lVar13 + -8) = 0x10694c;
        fseek(pFVar4,0x110,0);
        pbVar10 = this->fs_br;
        cVar15 = pbVar10->fat_copies;
        if ('\0' < cVar15) {
          do {
            pFVar4 = (FILE *)this->fs;
            *(undefined8 *)(auStack_c8 + lVar13 + -8) = 0x10697b;
            fwrite(puVar14,(ulong)uVar19 << 2,1,pFVar4);
            iVar11 = iVar11 + 1;
            pbVar10 = this->fs_br;
            cVar15 = pbVar10->fat_copies;
          } while (iVar11 < cVar15);
        }
        uVar2 = pbVar10->cluster_size;
        uVar19 = (uint)uVar2;
        puVar14 = puVar14 + -(ulong)(uVar19 + 0xf & 0xfffffff0);
        *(undefined8 *)(puVar14 + -8) = 0x1069c0;
        memset(puVar14,0,(ulong)uVar19);
        pFVar4 = (FILE *)this->fs;
        iVar11 = pbVar10->usable_cluster_count;
        *(undefined8 *)(puVar14 + -8) = 0x1069ee;
        fseek(pFVar4,(long)(int)(dir_cluster * (int)(short)uVar2) + (long)iVar11 * (long)cVar15 * 4
                     + 0x110,0);
        pFVar4 = (FILE *)this->fs;
        *(undefined8 *)(puVar14 + -8) = 0x106a02;
        fwrite(puVar14,(ulong)uVar19,1,pFVar4);
        *(undefined8 *)(puVar14 + -8) = 0x106a1d;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OK",2);
        uVar5 = *(undefined8 *)(std::cout + -0x18);
        *(undefined8 *)(puVar14 + -8) = 0x106a31;
        std::ios::widen((char)uVar5 + '(');
        *(undefined8 *)(puVar14 + -8) = 0x106a40;
        std::ostream::put('(');
        *(undefined8 *)(puVar14 + -8) = 0x106a48;
        std::ostream::flush();
        pdVar8 = dir_children.super__Vector_base<fat::directory,_std::allocator<fat::directory>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        if (result.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          pdVar8[-1].size = 0x106a5a;
          pdVar8[-1].start_cluster = 0;
          operator_delete(result.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        pvVar6 = (void *)CONCAT71(local_90._1_7_,local_90[0]);
        if (pvVar6 != (void *)0x0) {
          pdVar8[-1].size = 0x106a6b;
          pdVar8[-1].start_cluster = 0;
          operator_delete(pvVar6);
        }
        pdVar8[-1].size = 0x106a74;
        pdVar8[-1].start_cluster = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_70);
        return;
      }
      puStack_d0 = (undefined1 *)0x106ae7;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"PATH NOT FOUND",0xe)
      ;
      puStack_d0 = (undefined1 *)0x106af3;
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    else {
      puStack_d0 = (undefined1 *)0x106ac1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"PATH NOT EMPTY",0xe)
      ;
      puStack_d0 = (undefined1 *)0x106acd;
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
  }
  puStack_d0 = &LAB_00106afd;
  exit(1);
}

Assistant:

void fat::delete_directory(std::string dir_path) {
    std::vector<std::string> result = explode(dir_path, '/');
    if(result.size() == 0){
        std::cout << "CANNOT DELETE ROOT" << std::endl;
        exit(1);
    }
    int32_t directory = get_parent_cluster(result);
    std::vector<fat::directory> dir_children = get_dir_children(directory);
    if (dir_children.size() > 0) {
        std::cout << "PATH NOT EMPTY" << std::endl;
        exit(1);
    }

    if (directory < 0) {
        std::cout << "PATH NOT FOUND" << std::endl;
        exit(1);
    }

    result.pop_back();
    int32_t parent = get_parent_cluster(result);
    std::vector<fat::directory> parent_children = get_dir_children(parent);
    // ---
    // Updating the parent directory content
    // ---
    fseek(fs, (sizeof(boot_record) + (fs_br->fat_copies * sizeof(*fat_table) * fs_br->usable_cluster_count) +
               parent * fs_br->cluster_size), SEEK_SET);
    int16_t ac_size = 0;
    for (int j = 0; j < parent_children.size(); j++) {
        if (parent_children.at(j).start_cluster != directory) {
            fwrite(&parent_children.at(j), sizeof(fat::directory), 1, fs);
            ac_size += sizeof(fat::directory);
        }
    }
    char buffer[] = {'\0'};
    for (int16_t i = 0; i < (fs_br->cluster_size - ac_size); i++) {
        fwrite(buffer, sizeof(buffer), 1, fs);
    }

    // ---
    // Updating all FAT table copies
    // ---
    int32_t new_fat[fs_br->usable_cluster_count];
    for (int k = 0; k < fs_br->usable_cluster_count; k++) {
        new_fat[k] = fat_table[k];
    }
    new_fat[directory] = FAT_UNUSED;

    fseek(fs, sizeof(boot_record), SEEK_SET);
    for (int i = 0; i < fs_br->fat_copies; i++) {
        fwrite(&new_fat, sizeof(new_fat), 1, fs);
    }

    // ---
    // Erasing directory 'content' in FAT, just to be sure
    // ---
    char cluster_empty[fs_br->cluster_size];
    memset(cluster_empty, '\0', sizeof(cluster_empty));
    fseek(fs, (sizeof(boot_record) + (fs_br->fat_copies * sizeof(*fat_table) * fs_br->usable_cluster_count) +
               directory * fs_br->cluster_size), SEEK_SET);
    fwrite(&cluster_empty, sizeof(cluster_empty), 1, fs);

    std::cout << "OK" << std::endl;
}